

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  ostream *poVar1;
  char cVar2;
  TablePrinter *pTVar3;
  allocator_type *in_RCX;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  long lVar4;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l_00;
  allocator<char> local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  local_e8;
  ColumnInfo local_d0;
  string local_a8 [32];
  undefined8 local_88;
  string local_80 [32];
  undefined8 local_60;
  string local_58 [32];
  undefined8 local_38;
  
  StreamingReporterBase<Catch::ConsoleReporter>::StreamingReporterBase
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,config);
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__ConsoleReporter_009b5d68;
  pTVar3 = (TablePrinter *)operator_new(0x1a0);
  poVar1 = config->m_stream;
  clara::std::__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,
             &(config->m_fullConfig).
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>);
  cVar2 = (**(code **)(*(long *)local_d0.name._M_dataplus._M_p + 0xa8))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0.name._M_string_length);
  if (cVar2 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"benchmark name",&local_e9);
    local_d0.width = 0x25;
    local_d0.justification = Left;
    std::__cxx11::string::string<std::allocator<char>>
              (local_a8,"samples      mean       std dev",&local_ea);
    local_88 = 0x10000000e;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"iterations   low mean   low std dev",&local_eb);
    local_60 = 0x10000000e;
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,"estimated    high mean  high std dev",&local_ec);
    local_38 = 0x10000000e;
    __l_00._M_len = extraout_RDX_00;
    __l_00._M_array = &local_d0;
    clara::std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_e8,__l_00,in_RCX);
    lVar4 = 0x78;
    do {
      std::__cxx11::string::~string(local_a8 + lVar4 + -0x28);
      lVar4 = lVar4 + -0x28;
    } while (lVar4 != -0x28);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"benchmark name",&local_e9);
    local_d0.width = 0x25;
    local_d0.justification = Left;
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"     samples",&local_ea);
    local_88 = 0x10000000e;
    std::__cxx11::string::string<std::allocator<char>>(local_80,"  iterations",&local_eb);
    local_60 = 0x10000000e;
    std::__cxx11::string::string<std::allocator<char>>(local_58,"        mean",&local_ec);
    local_38 = 0x10000000e;
    __l._M_len = extraout_RDX;
    __l._M_array = &local_d0;
    clara::std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_e8,__l,in_RCX);
    lVar4 = 0x78;
    do {
      std::__cxx11::string::~string(local_a8 + lVar4 + -0x28);
      lVar4 = lVar4 + -0x28;
    } while (lVar4 != -0x28);
  }
  pTVar3->m_os = poVar1;
  *(pointer *)
   &(pTVar3->m_columnInfos).
    super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ._M_impl = local_e8.
               super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(pTVar3->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
   + 8) = local_e8.
          super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(pTVar3->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
   + 0x10) = local_e8.
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e8.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTVar3->m_oss);
  pTVar3->m_currentColumn = -1;
  pTVar3->m_isOpen = false;
  (this->m_tablePrinter)._M_t.
  super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>._M_t.
  super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
  super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl = pTVar3;
  clara::std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(&local_e8);
  this->m_headerPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig const& config)
    : StreamingReporterBase(config),
    m_tablePrinter(new TablePrinter(config.stream(),
        [&config]() -> std::vector<ColumnInfo> {
        if (config.fullConfig()->benchmarkNoAnalysis())
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "     samples", 14, ColumnInfo::Right },
                { "  iterations", 14, ColumnInfo::Right },
                { "        mean", 14, ColumnInfo::Right }
            };
        }
        else
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "samples      mean       std dev", 14, ColumnInfo::Right },
                { "iterations   low mean   low std dev", 14, ColumnInfo::Right },
                { "estimated    high mean  high std dev", 14, ColumnInfo::Right }
            };
        }
    }())) {}